

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O1

uint32 solve_quadratic(float64 x,float64 y,float64 z,float64 *root1,float64 *root2)

{
  double dVar1;
  
  if (((double)x != 0.0) || (NAN((double)x))) {
    dVar1 = (double)x * -4.0 * (double)z + (double)y * (double)y;
    if (0.0 <= dVar1) {
      if (dVar1 < 0.0) {
        dVar1 = sqrt(dVar1);
      }
      else {
        dVar1 = SQRT(dVar1);
      }
      *root1 = (float64)((dVar1 - (double)y) / ((double)x + (double)x));
      *root2 = (float64)((-dVar1 - (double)y) / ((double)x + (double)x));
    }
    else {
      if (((double)y == 0.0) && (!NAN((double)y))) {
        return 0;
      }
      if (0.0001 <= ABS(dVar1 / ((double)y * (double)y))) {
        return 0;
      }
      dVar1 = -(double)y / ((double)x + (double)x);
      *root2 = (float64)dVar1;
      *root1 = (float64)dVar1;
    }
  }
  else {
    if (((double)y == 0.0) && (!NAN((double)y))) {
      return 0;
    }
    *root2 = (float64)(-(double)z / (double)y);
    *root1 = (float64)(-(double)z / (double)y);
  }
  return 1;
}

Assistant:

uint32
solve_quadratic(float64 x, float64 y, float64 z, float64 *root1, float64 *root2)
{
    float64 temp;
    
    if (x == 0) {
	if (y != 0) {
	    (*root1) = (*root2) = -z/y;
	    return TRUE;
	}
	else
	    return FALSE;
    }
    
    temp = y * y - (4 * x * z);
    if (temp < 0) {
	if (y != 0 && fabs(temp/(y*y)) < 0.0001) {
	    (*root1) = (*root2) = (-y / (2*x));
	    return TRUE;
	}
	else
	    return FALSE;
    }
    
    temp = sqrt(temp);
    
    (*root1) = (temp - y) / (2*x);
    (*root2) = (-temp - y) / (2*x);
    
    return TRUE;
}